

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# inja.hpp
# Opt level: O1

Template * __thiscall
inja::Environment::parse_template
          (Template *__return_storage_ptr__,Environment *this,string *filename)

{
  _Head_base<0UL,_inja::Environment::Impl_*,_false> _Var1;
  pointer pcVar2;
  size_type sVar3;
  string_view filename_00;
  long *plVar4;
  long *plVar5;
  Parser parser;
  long *local_110;
  long local_100;
  long lStack_f8;
  undefined1 *local_f0 [2];
  undefined1 local_e0 [16];
  Parser local_d0;
  
  _Var1._M_head_impl =
       (this->m_impl)._M_t.
       super___uniq_ptr_impl<inja::Environment::Impl,_std::default_delete<inja::Environment::Impl>_>
       ._M_t.
       super__Tuple_impl<0UL,_inja::Environment::Impl_*,_std::default_delete<inja::Environment::Impl>_>
       .super__Head_base<0UL,_inja::Environment::Impl_*,_false>._M_head_impl;
  local_d0.m_config = &(_Var1._M_head_impl)->parser_config;
  local_d0.m_lexer.m_config = &(_Var1._M_head_impl)->lexer_config;
  local_d0.m_included_templates = &(_Var1._M_head_impl)->included_templates;
  local_d0.m_lexer.m_in.data_ = (const_pointer)0x0;
  local_d0.m_lexer.m_in.size_ = 0;
  local_d0.m_tok.kind = Unknown;
  local_d0.m_tok.text.data_ = (const_pointer)0x0;
  local_d0.m_tok.text.size_ = 0;
  local_d0.m_peek_tok.kind = Unknown;
  local_d0.m_peek_tok.text.data_ = (const_pointer)0x0;
  local_d0.m_peek_tok.text.size_ = 0;
  local_d0.m_have_peek_tok = false;
  local_d0.m_static = ParserStatic::get_instance();
  local_d0.m_if_stack.
  super__Vector_base<inja::Parser::IfData,_std::allocator<inja::Parser::IfData>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_d0.m_if_stack.
  super__Vector_base<inja::Parser::IfData,_std::allocator<inja::Parser::IfData>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  local_d0.m_if_stack.
  super__Vector_base<inja::Parser::IfData,_std::allocator<inja::Parser::IfData>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_d0.m_loop_stack.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_d0.m_loop_stack.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  local_d0.m_loop_stack.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  _Var1._M_head_impl =
       (this->m_impl)._M_t.
       super___uniq_ptr_impl<inja::Environment::Impl,_std::default_delete<inja::Environment::Impl>_>
       ._M_t.
       super__Tuple_impl<0UL,_inja::Environment::Impl_*,_std::default_delete<inja::Environment::Impl>_>
       .super__Head_base<0UL,_inja::Environment::Impl_*,_false>._M_head_impl;
  pcVar2 = (filename->_M_dataplus)._M_p;
  local_f0[0] = local_e0;
  std::__cxx11::string::_M_construct<char*>
            ((string *)local_f0,pcVar2,pcVar2 + filename->_M_string_length);
  plVar4 = (long *)std::__cxx11::string::replace
                             ((ulong)local_f0,0,(char *)0x0,
                              *(ulong *)&(_Var1._M_head_impl)->input_path);
  plVar5 = plVar4 + 2;
  if ((long *)*plVar4 == plVar5) {
    local_100 = *plVar5;
    lStack_f8 = plVar4[3];
    local_110 = &local_100;
  }
  else {
    local_100 = *plVar5;
    local_110 = (long *)*plVar4;
  }
  sVar3 = plVar4[1];
  *plVar4 = (long)plVar5;
  plVar4[1] = 0;
  *(undefined1 *)(plVar4 + 2) = 0;
  filename_00.size_ = sVar3;
  filename_00.data_ = (const_pointer)local_110;
  Parser::parse_template(__return_storage_ptr__,&local_d0,filename_00);
  if (local_110 != &local_100) {
    operator_delete(local_110);
  }
  if (local_f0[0] != local_e0) {
    operator_delete(local_f0[0]);
  }
  if (local_d0.m_loop_stack.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_d0.m_loop_stack.
                    super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                    super__Vector_impl_data._M_start);
  }
  std::vector<inja::Parser::IfData,_std::allocator<inja::Parser::IfData>_>::~vector
            (&local_d0.m_if_stack);
  return __return_storage_ptr__;
}

Assistant:

Template parse_template(const std::string& filename) {
		Parser parser(m_impl->parser_config, m_impl->lexer_config, m_impl->included_templates);
		return parser.parse_template(m_impl->input_path + static_cast<std::string>(filename));
	}